

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

void __thiscall cmOutputConverter::ComputeRelativePathTopRelation(cmOutputConverter *this)

{
  bool bVar1;
  cmOutputConverter *this_local;
  
  bVar1 = cmsys::SystemTools::ComparePath(&this->RelativePathTopSource,&this->RelativePathTopBinary)
  ;
  if (bVar1) {
    this->RelativePathTopRelation = InSource;
  }
  else {
    bVar1 = cmsys::SystemTools::IsSubDirectory
                      (&this->RelativePathTopBinary,&this->RelativePathTopSource);
    if (bVar1) {
      this->RelativePathTopRelation = BinInSrc;
    }
    else {
      bVar1 = cmsys::SystemTools::IsSubDirectory
                        (&this->RelativePathTopSource,&this->RelativePathTopBinary);
      if (bVar1) {
        this->RelativePathTopRelation = SrcInBin;
      }
      else {
        this->RelativePathTopRelation = Separate;
      }
    }
  }
  return;
}

Assistant:

void cmOutputConverter::ComputeRelativePathTopRelation()
{
  if (cmSystemTools::ComparePath(this->RelativePathTopSource,
                                 this->RelativePathTopBinary)) {
    this->RelativePathTopRelation = TopRelation::InSource;
  } else if (cmSystemTools::IsSubDirectory(this->RelativePathTopBinary,
                                           this->RelativePathTopSource)) {
    this->RelativePathTopRelation = TopRelation::BinInSrc;
  } else if (cmSystemTools::IsSubDirectory(this->RelativePathTopSource,
                                           this->RelativePathTopBinary)) {
    this->RelativePathTopRelation = TopRelation::SrcInBin;
  } else {
    this->RelativePathTopRelation = TopRelation::Separate;
  }
}